

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftcep.cc
# Opt level: O1

int main(int argc,char **argv)

{
  InputOutputFormats input_format;
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  size_t sVar6;
  int iVar7;
  string *this;
  char *__s;
  long lVar8;
  int fft_length;
  int num_order;
  int num_iteration;
  double relative_floor_in_decibels;
  double epsilon;
  double acceleration_factor;
  ostringstream error_message_10;
  vector<double,_std::allocator<double>_> output;
  vector<double,_std::allocator<double>_> processed_input;
  vector<double,_std::allocator<double>_> input;
  ifstream ifs;
  FastFourierTransformCepstralAnalysis analysis;
  Buffer buffer_for_cepstral_analysis;
  SpectrumToSpectrum spectrum_to_spectrum;
  Buffer buffer_for_spectral_analysis;
  WaveformToSpectrum waveform_to_spectrum;
  int local_7e0;
  int local_7dc;
  InputOutputFormats local_7d8;
  int local_7d4;
  string local_7d0;
  double local_7b0;
  double local_7a8;
  double local_7a0;
  string local_798 [3];
  ios_base local_728 [264];
  vector<double,_std::allocator<double>_> local_620;
  vector<double,_std::allocator<double>_> local_608;
  vector<double,_std::allocator<double>_> local_5f0;
  string local_5d8;
  byte abStack_5b8 [80];
  ios_base local_568 [408];
  FastFourierTransformCepstralAnalysis local_3d0;
  Buffer local_2d8;
  SpectrumToSpectrum local_228;
  Buffer local_1e0;
  WaveformToSpectrum local_120;
  
  local_7e0 = 0x100;
  local_7dc = 0x19;
  local_7d4 = 0;
  iVar7 = 0;
  local_7a0 = 0.0;
  local_7a8 = 0.0;
  local_7b0 = -1.79769313486232e+308;
  local_7d8 = kNumInputOutputFormats;
  do {
    iVar4 = ya_getopt_long(argc,argv,"l:m:i:a:q:e:E:h",(option *)0x0,(int *)0x0);
    switch(iVar4) {
    case 0x61:
      std::__cxx11::string::string((string *)&local_5d8,ya_optarg,(allocator *)local_798);
      bVar1 = sptk::ConvertStringToDouble(&local_5d8,&local_7a0);
      bVar2 = local_7a0 < 0.0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
        operator_delete(local_5d8._M_dataplus._M_p);
      }
      if (!bVar1 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_5d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_5d8,"The argument for the -a option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_5d8,"non-negative number",0x13);
        local_798[0]._M_dataplus._M_p = (pointer)&local_798[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_798,"fftcep","");
        sptk::PrintErrorMessage(local_798,(ostringstream *)&local_5d8);
        goto LAB_00104e83;
      }
LAB_00104cb8:
      iVar4 = 0;
      break;
    case 0x62:
    case 99:
    case 100:
    case 0x66:
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
    case 0x70:
switchD_001048cb_caseD_62:
      anon_unknown.dwarf_2beb::PrintUsage((ostream *)&std::cerr);
      goto LAB_00104eb3;
    case 0x65:
      std::__cxx11::string::string((string *)&local_5d8,ya_optarg,(allocator *)local_798);
      bVar1 = sptk::ConvertStringToDouble(&local_5d8,&local_7a8);
      bVar2 = 0.0 < local_7a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
        operator_delete(local_5d8._M_dataplus._M_p);
      }
      if (bVar1 && bVar2) goto LAB_00104cb8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_5d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_5d8,"The argument for the -e option must be a positive number",
                 0x38);
      local_798[0]._M_dataplus._M_p = (pointer)&local_798[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_798,"fftcep","");
      sptk::PrintErrorMessage(local_798,(ostringstream *)&local_5d8);
      goto LAB_00104e83;
    case 0x68:
      anon_unknown.dwarf_2beb::PrintUsage((ostream *)&std::cout);
      iVar7 = 0;
      iVar4 = 1;
      break;
    case 0x69:
      std::__cxx11::string::string((string *)&local_5d8,ya_optarg,(allocator *)local_798);
      bVar2 = sptk::ConvertStringToInteger(&local_5d8,&local_7d4);
      bVar1 = -1 < local_7d4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
        operator_delete(local_5d8._M_dataplus._M_p);
      }
      if (bVar2 && bVar1) goto LAB_00104cb8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_5d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_5d8,"The argument for the -i option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_5d8,"non-negative integer",0x14);
      local_798[0]._M_dataplus._M_p = (pointer)&local_798[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_798,"fftcep","");
      sptk::PrintErrorMessage(local_798,(ostringstream *)&local_5d8);
      goto LAB_00104e83;
    case 0x6c:
      std::__cxx11::string::string((string *)&local_5d8,ya_optarg,(allocator *)local_798);
      bVar2 = sptk::ConvertStringToInteger(&local_5d8,&local_7e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
        operator_delete(local_5d8._M_dataplus._M_p);
      }
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_5d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_5d8,"The argument for the -l option must be an integer",0x31);
        local_798[0]._M_dataplus._M_p = (pointer)&local_798[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_798,"fftcep","");
        sptk::PrintErrorMessage(local_798,(ostringstream *)&local_5d8);
        goto LAB_00104e83;
      }
      iVar4 = 0;
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&local_5d8,ya_optarg,(allocator *)local_798);
      bVar2 = sptk::ConvertStringToInteger(&local_5d8,&local_7dc);
      bVar1 = -1 < local_7dc;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
        operator_delete(local_5d8._M_dataplus._M_p);
      }
      if (bVar2 && bVar1) goto LAB_00104cb8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_5d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_5d8,"The argument for the -m option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_5d8,"non-negative integer",0x14);
      local_798[0]._M_dataplus._M_p = (pointer)&local_798[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_798,"fftcep","");
      sptk::PrintErrorMessage(local_798,(ostringstream *)&local_5d8);
      goto LAB_00104e83;
    case 0x71:
      std::__cxx11::string::string((string *)&local_5d8,ya_optarg,(allocator *)local_798);
      bVar2 = sptk::ConvertStringToInteger(&local_5d8,(int *)&local_3d0);
      if (bVar2) {
        bVar2 = sptk::IsInRange((InputOutputFormats)
                                local_3d0._vptr_FastFourierTransformCepstralAnalysis,0,4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
          operator_delete(local_5d8._M_dataplus._M_p);
        }
        if (bVar2) {
          iVar4 = 0;
          local_7d8 = (InputOutputFormats)local_3d0._vptr_FastFourierTransformCepstralAnalysis;
          break;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
        operator_delete(local_5d8._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_5d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_5d8,"The argument for the -q option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_5d8,"in the range of ",0x10);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_5d8,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," to ",4);
      std::ostream::operator<<((ostream *)poVar5,4);
      local_798[0]._M_dataplus._M_p = (pointer)&local_798[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_798,"fftcep","");
      sptk::PrintErrorMessage(local_798,(ostringstream *)&local_5d8);
LAB_00104e83:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_798[0]._M_dataplus._M_p != &local_798[0].field_2) {
        operator_delete(local_798[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_5d8);
      std::ios_base::~ios_base(local_568);
LAB_00104eb3:
      iVar4 = 1;
      iVar7 = 1;
      break;
    default:
      if (iVar4 != -1) {
        if (iVar4 == 0x45) {
          std::__cxx11::string::string((string *)&local_5d8,ya_optarg,(allocator *)local_798);
          bVar1 = sptk::ConvertStringToDouble(&local_5d8,&local_7b0);
          bVar2 = 0.0 <= local_7b0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
            operator_delete(local_5d8._M_dataplus._M_p);
          }
          if (!bVar1 || bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_5d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_5d8,
                       "The argument for the -E option must be a negative number",0x38);
            local_798[0]._M_dataplus._M_p = (pointer)&local_798[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_798,"fftcep","");
            sptk::PrintErrorMessage(local_798,(ostringstream *)&local_5d8);
            goto LAB_00104e83;
          }
          goto LAB_00104cb8;
        }
        goto switchD_001048cb_caseD_62;
      }
      iVar4 = 2;
    }
    input_format = local_7d8;
  } while (iVar4 == 0);
  if (iVar4 == 2) {
    iVar7 = local_7e0 / 2;
    if (iVar7 < local_7dc) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_5d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_5d8,"Order of cepstrum ",0x12);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_5d8,local_7dc);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," must be equal to or less than half of FFT length ",0x32);
      std::ostream::operator<<((ostream *)poVar5,iVar7);
      local_798[0]._M_dataplus._M_p = (pointer)&local_798[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_798,"fftcep","");
      sptk::PrintErrorMessage(local_798,(ostringstream *)&local_5d8);
    }
    else if (argc - ya_optind < 2) {
      if (argc == ya_optind) {
        __s = (char *)0x0;
      }
      else {
        __s = argv[ya_optind];
      }
      bVar2 = sptk::SetBinaryMode();
      this = &local_5d8;
      if (bVar2) {
        std::ifstream::ifstream(this);
        if ((__s == (char *)0x0) ||
           (std::ifstream::open((char *)&local_5d8,(_Ios_Openmode)__s),
           (abStack_5b8[*(long *)(local_5d8._M_dataplus._M_p + -0x18)] & 5) == 0)) {
          cVar3 = std::__basic_file<char>::is_open();
          if (cVar3 == '\0') {
            this = (string *)&std::cin;
          }
          sptk::SpectrumToSpectrum::SpectrumToSpectrum
                    (&local_228,local_7e0,input_format,kPowerSpectrum,local_7a8,local_7b0);
          if ((input_format == kNumInputOutputFormats) || (local_228.is_valid_ != false)) {
            sptk::WaveformToSpectrum::WaveformToSpectrum
                      (&local_120,local_7e0,local_7e0,kPowerSpectrum,local_7a8,local_7b0);
            local_1e0._vptr_Buffer = (_func_int **)&PTR__Buffer_001156e8;
            local_1e0.buffer_._vptr_Buffer = (_func_int **)&PTR__Buffer_00115718;
            local_1e0.buffer_.fast_fourier_transform_buffer_._vptr_Buffer =
                 (_func_int **)&PTR__Buffer_00115748;
            memset(&local_1e0.buffer_.fast_fourier_transform_buffer_.real_part_input_,0,0xa8);
            if ((input_format == kNumInputOutputFormats) &&
               (local_120.filter_coefficients_to_spectrum_.is_valid_ == false)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_798);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_798,"Failed to initialize WaveformToSpectrum",0x27);
              local_3d0._vptr_FastFourierTransformCepstralAnalysis =
                   (_func_int **)&local_3d0.acceleration_factor_;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"fftcep","");
              sptk::PrintErrorMessage((string *)&local_3d0,(ostringstream *)local_798);
              if (local_3d0._vptr_FastFourierTransformCepstralAnalysis !=
                  (_func_int **)&local_3d0.acceleration_factor_) {
                operator_delete(local_3d0._vptr_FastFourierTransformCepstralAnalysis);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_798);
              std::ios_base::~ios_base(local_728);
              iVar7 = 1;
            }
            else {
              sptk::FastFourierTransformCepstralAnalysis::FastFourierTransformCepstralAnalysis
                        (&local_3d0,local_7e0,local_7dc,local_7d4,local_7a0);
              local_2d8._vptr_Buffer = (_func_int **)&PTR__Buffer_00115778;
              local_2d8.real_part_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_2d8.real_part_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2d8.real_part_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_2d8.imag_part_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_2d8.imag_part_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2d8.imag_part_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_2d8.buffer_for_fast_fourier_transform_._vptr_Buffer =
                   (_func_int **)&PTR__Buffer_00115748;
              local_2d8.buffer_for_fast_fourier_transform_.real_part_input_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              local_2d8.buffer_for_fast_fourier_transform_.real_part_input_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)0x0;
              local_2d8.buffer_for_fast_fourier_transform_.real_part_input_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = (pointer)0x0;
              local_2d8.buffer_for_fast_fourier_transform_.imag_part_input_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              local_2d8.buffer_for_fast_fourier_transform_.imag_part_input_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)0x0;
              local_2d8.buffer_for_fast_fourier_transform_.imag_part_input_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = (pointer)0x0;
              local_2d8.buffer_for_inverse_fast_fourier_transform_._vptr_Buffer =
                   (_func_int **)&PTR__Buffer_001157a8;
              local_2d8.buffer_for_inverse_fast_fourier_transform_.fast_fourier_transform_buffer_.
              _vptr_Buffer = (_func_int **)&PTR__Buffer_00115748;
              local_2d8.buffer_for_inverse_fast_fourier_transform_.fast_fourier_transform_buffer_.
              real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_2d8.buffer_for_inverse_fast_fourier_transform_.fast_fourier_transform_buffer_.
              real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2d8.buffer_for_inverse_fast_fourier_transform_.fast_fourier_transform_buffer_.
              real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_2d8.buffer_for_inverse_fast_fourier_transform_.fast_fourier_transform_buffer_.
              imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_2d8.buffer_for_inverse_fast_fourier_transform_.fast_fourier_transform_buffer_.
              imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2d8.buffer_for_inverse_fast_fourier_transform_.fast_fourier_transform_buffer_.
              imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (local_3d0.is_valid_ == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_798);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_798,
                           "Failed to initialize FastFourierTransformCepstralAnalysis",0x39);
                local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"fftcep","");
                sptk::PrintErrorMessage(&local_7d0,(ostringstream *)local_798);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
                  operator_delete(local_7d0._M_dataplus._M_p);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_798);
                std::ios_base::~ios_base(local_728);
                iVar7 = 1;
              }
              else {
                iVar7 = local_7e0;
                if (input_format != kNumInputOutputFormats) {
                  iVar7 = local_7e0 / 2 + 1;
                }
                lVar8 = (long)local_7dc;
                std::vector<double,_std::allocator<double>_>::vector
                          (&local_5f0,(long)iVar7,(allocator_type *)local_798);
                std::vector<double,_std::allocator<double>_>::vector
                          (&local_608,(long)(local_7e0 / 2 + 1),(allocator_type *)local_798);
                std::vector<double,_std::allocator<double>_>::vector
                          (&local_620,lVar8 + 1U,(allocator_type *)local_798);
                do {
                  bVar2 = sptk::ReadStream<double>
                                    (false,0,0,iVar7,&local_5f0,(istream *)this,(int *)0x0);
                  if (!bVar2) {
                    iVar7 = 0;
                    goto LAB_00105782;
                  }
                  if (local_7d8 == kNumInputOutputFormats) {
                    bVar2 = sptk::WaveformToSpectrum::Run
                                      (&local_120,&local_5f0,&local_608,&local_1e0);
                    if (!bVar2) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_798);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_798,"Failed to transform waveform to spectrum",
                                 0x28);
                      local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_7d0,"fftcep","");
                      sptk::PrintErrorMessage(&local_7d0,(ostringstream *)local_798);
                      goto LAB_0010574f;
                    }
                  }
                  else {
                    bVar2 = sptk::SpectrumToSpectrum::Run(&local_228,&local_5f0,&local_608);
                    if (!bVar2) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_798);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_798,"Failed to convert spectrum",0x1a);
                      local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_7d0,"fftcep","");
                      sptk::PrintErrorMessage(&local_7d0,(ostringstream *)local_798);
                      goto LAB_0010574f;
                    }
                  }
                  bVar2 = sptk::FastFourierTransformCepstralAnalysis::Run
                                    (&local_3d0,&local_608,&local_620,&local_2d8);
                  if (!bVar2) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_798);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_798,"Failed to run FFT cepstral analysis",0x23);
                    local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_7d0,"fftcep","");
                    sptk::PrintErrorMessage(&local_7d0,(ostringstream *)local_798);
                    goto LAB_0010574f;
                  }
                  bVar2 = sptk::WriteStream<double>
                                    (0,(int)(lVar8 + 1U),&local_620,(ostream *)&std::cout,(int *)0x0
                                    );
                } while (bVar2);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_798);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_798,"Failed to write FFT cepstrum",0x1c);
                local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"fftcep","");
                sptk::PrintErrorMessage(&local_7d0,(ostringstream *)local_798);
LAB_0010574f:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
                  operator_delete(local_7d0._M_dataplus._M_p);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_798);
                std::ios_base::~ios_base(local_728);
                iVar7 = 1;
LAB_00105782:
                if (local_620.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_620.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_608.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_608.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_5f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_5f0.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
              }
              sptk::FastFourierTransformCepstralAnalysis::Buffer::~Buffer(&local_2d8);
              local_3d0._vptr_FastFourierTransformCepstralAnalysis =
                   (_func_int **)&PTR__FastFourierTransformCepstralAnalysis_001157d8;
              local_3d0.inverse_fast_fourier_transform_._vptr_RealValuedInverseFastFourierTransform
                   = (_func_int **)&PTR__RealValuedInverseFastFourierTransform_00115808;
              sptk::RealValuedFastFourierTransform::~RealValuedFastFourierTransform
                        (&local_3d0.inverse_fast_fourier_transform_.fast_fourier_transform_);
              sptk::RealValuedFastFourierTransform::~RealValuedFastFourierTransform
                        (&local_3d0.fast_fourier_transform_);
            }
            local_1e0._vptr_Buffer = (_func_int **)&PTR__Buffer_001156e8;
            sptk::FilterCoefficientsToSpectrum::Buffer::~Buffer(&local_1e0.buffer_);
            sptk::WaveformToSpectrum::~WaveformToSpectrum(&local_120);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_798);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_798,"Failed to initialize SpectrumToSpectrum",0x27);
            local_3d0._vptr_FastFourierTransformCepstralAnalysis =
                 (_func_int **)&local_3d0.acceleration_factor_;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"fftcep","");
            sptk::PrintErrorMessage((string *)&local_3d0,(ostringstream *)local_798);
            if (local_3d0._vptr_FastFourierTransformCepstralAnalysis !=
                (_func_int **)&local_3d0.acceleration_factor_) {
              operator_delete(local_3d0._vptr_FastFourierTransformCepstralAnalysis);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_798);
            std::ios_base::~ios_base(local_728);
            iVar7 = 1;
          }
          sptk::SpectrumToSpectrum::~SpectrumToSpectrum(&local_228);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_798);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_798,"Cannot open file ",0x11);
          sVar6 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_798,__s,sVar6);
          local_3d0._vptr_FastFourierTransformCepstralAnalysis =
               (_func_int **)&local_3d0.acceleration_factor_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"fftcep","");
          sptk::PrintErrorMessage((string *)&local_3d0,(ostringstream *)local_798);
          if (local_3d0._vptr_FastFourierTransformCepstralAnalysis !=
              (_func_int **)&local_3d0.acceleration_factor_) {
            operator_delete(local_3d0._vptr_FastFourierTransformCepstralAnalysis);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_798);
          std::ios_base::~ios_base(local_728);
          iVar7 = 1;
        }
        std::ifstream::~ifstream(&local_5d8);
        return iVar7;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"Cannot set translation mode",0x1b);
      local_798[0]._M_dataplus._M_p = (pointer)&local_798[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_798,"fftcep","");
      sptk::PrintErrorMessage(local_798,(ostringstream *)&local_5d8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_5d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_5d8,"Too many input files",0x14);
      local_798[0]._M_dataplus._M_p = (pointer)&local_798[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_798,"fftcep","");
      sptk::PrintErrorMessage(local_798,(ostringstream *)&local_5d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798[0]._M_dataplus._M_p != &local_798[0].field_2) {
      operator_delete(local_798[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_5d8);
    std::ios_base::~ios_base(local_568);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int main(int argc, char* argv[]) {
  int fft_length(kDefaultFftLength);
  int num_order(kDefaultNumOrder);
  int num_iteration(kDefaultNumIteration);
  double acceleration_factor(kDefaultAccelerationFactor);
  InputFormats input_format(kDefaultInputFormat);
  double epsilon(0.0);
  double relative_floor_in_decibels(sptk::kMin);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "l:m:i:a:q:e:E:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &num_iteration) ||
            num_iteration < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &acceleration_factor) ||
            acceleration_factor < 0.0) {
          std::ostringstream error_message;
          error_message << "The argument for the -a option must be a "
                        << "non-negative number";
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToDouble(optarg, &epsilon) || epsilon <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be a positive number";
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        break;
      }
      case 'E': {
        if (!sptk::ConvertStringToDouble(optarg, &relative_floor_in_decibels) ||
            0.0 <= relative_floor_in_decibels) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -E option must be a negative number";
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int half_fft_length(fft_length / 2);
  if (half_fft_length < num_order) {
    std::ostringstream error_message;
    error_message << "Order of cepstrum " << num_order
                  << " must be equal to or less than half of FFT length "
                  << half_fft_length;
    sptk::PrintErrorMessage("fftcep", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("fftcep", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("fftcep", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("fftcep", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::SpectrumToSpectrum spectrum_to_spectrum(
      fft_length,
      static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(input_format),
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum, epsilon,
      relative_floor_in_decibels);
  if (kWaveform != input_format && !spectrum_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize SpectrumToSpectrum";
    sptk::PrintErrorMessage("fftcep", error_message);
    return 1;
  }

  sptk::WaveformToSpectrum waveform_to_spectrum(
      fft_length, fft_length,
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum, epsilon,
      relative_floor_in_decibels);
  sptk::WaveformToSpectrum::Buffer buffer_for_spectral_analysis;
  if (kWaveform == input_format && !waveform_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize WaveformToSpectrum";
    sptk::PrintErrorMessage("fftcep", error_message);
    return 1;
  }

  sptk::FastFourierTransformCepstralAnalysis analysis(
      fft_length, num_order, num_iteration, acceleration_factor);
  sptk::FastFourierTransformCepstralAnalysis::Buffer
      buffer_for_cepstral_analysis;
  if (!analysis.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize FastFourierTransformCepstralAnalysis";
    sptk::PrintErrorMessage("fftcep", error_message);
    return 1;
  }

  const int input_length(kWaveform == input_format ? fft_length
                                                   : fft_length / 2 + 1);
  const int output_length(num_order + 1);
  std::vector<double> input(input_length);
  std::vector<double> processed_input(fft_length / 2 + 1);
  std::vector<double> output(output_length);

  while (sptk::ReadStream(false, 0, 0, input_length, &input, &input_stream,
                          NULL)) {
    if (kWaveform == input_format) {
      if (!waveform_to_spectrum.Run(input, &processed_input,
                                    &buffer_for_spectral_analysis)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to spectrum";
        sptk::PrintErrorMessage("fftcep", error_message);
        return 1;
      }
    } else {
      if (!spectrum_to_spectrum.Run(input, &processed_input)) {
        std::ostringstream error_message;
        error_message << "Failed to convert spectrum";
        sptk::PrintErrorMessage("fftcep", error_message);
        return 1;
      }
    }

    if (!analysis.Run(processed_input, &output,
                      &buffer_for_cepstral_analysis)) {
      std::ostringstream error_message;
      error_message << "Failed to run FFT cepstral analysis";
      sptk::PrintErrorMessage("fftcep", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write FFT cepstrum";
      sptk::PrintErrorMessage("fftcep", error_message);
      return 1;
    }
  }

  return 0;
}